

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>
     ::match(matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>
            *matchers)

{
  int32_t *piVar1;
  matched_t<wasm::Match::Internal::AnyKind<int>_> casted;
  int32_t iVar2;
  Literal local_58;
  Literal local_40;
  GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0> local_21;
  
  Literal::Literal(&local_40,candidate);
  iVar2 = GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0>::operator()
                    (&local_21,&local_40);
  piVar1 = (matchers->curr).binder;
  if (piVar1 != (int32_t *)0x0) {
    *piVar1 = iVar2;
  }
  Literal::Literal(&local_58,candidate);
  Literal::~Literal(&local_58);
  Literal::~Literal(&local_40);
  return true;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }